

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O1

void __thiscall
TextReaderTest_ReadTillEndOfLine_Test::TestBody(TextReaderTest_ReadTillEndOfLine_Test *this)

{
  bool bVar1;
  char *message;
  NLStringRef data;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  TextReader reader;
  AssertHelper local_b0;
  AssertionResult local_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98 [2];
  long local_88 [2];
  TextReader<fmt::Locale> local_78;
  
  data.size_ = 0xb;
  data.data_ = "ab cde\nfg h";
  mp::internal::TextReader<fmt::Locale>::TextReader(&local_78,data,(CStringRef)0x27c549);
  mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(&local_78);
  testing::AssertionSuccess();
  if (local_a8.success_ == true) {
    local_98[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"test:2:5: expected newline","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(&local_78);
    }
    testing::AssertionResult::operator<<
              (&local_a8,
               (char (*) [109])
               "Expected: reader.ReadTillEndOfLine() throws an exception of type mp::ReadError.\n  Actual: it throws nothing."
              );
    if (local_98[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88) {
      operator_delete(local_98[0].ptr_,local_88[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_98);
  if (local_a8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((local_a8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x7e,message);
  testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  if (local_98[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_98[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_98[0].ptr_ + 8))();
    }
    local_98[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  freelocale((__locale_t)local_78.locale_.super_Locale.locale_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.super_ReaderBase.name_._M_dataplus._M_p !=
      &local_78.super_ReaderBase.name_.field_2) {
    operator_delete(local_78.super_ReaderBase.name_._M_dataplus._M_p,
                    local_78.super_ReaderBase.name_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(TextReaderTest, ReadTillEndOfLine) {
  TextReader reader("ab cde\nfg h", "test");
  reader.ReadTillEndOfLine();
  EXPECT_THROW_MSG(reader.ReadTillEndOfLine(), mp::ReadError,
                   "test:2:5: expected newline");
}